

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator_test.cc
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  Element *pEVar3;
  AsteriskDecorator *this;
  PlusDecorator *this_00;
  Element *pEVar4;
  string value;
  long *local_88 [2];
  long local_78 [2];
  string local_68;
  long *local_48;
  undefined8 local_40;
  long local_38;
  undefined2 local_30;
  
  pEVar3 = (Element *)operator_new(0x28);
  local_38 = 0x657461726f636f64;
  local_30 = 0x21;
  local_40 = 9;
  pEVar3->_vptr_Element = (_func_int **)&PTR_print_abi_cxx11__00103d00;
  pEVar3[1]._vptr_Element = (_func_int **)(pEVar3 + 3);
  local_48 = &local_38;
  std::__cxx11::string::_M_construct<char*>((string *)(pEVar3 + 1),&local_38,(long)&local_30 + 1);
  if (local_48 != &local_38) {
    operator_delete(local_48,local_38 + 1);
  }
  (**pEVar3->_vptr_Element)(local_88,pEVar3);
  iVar2 = std::__cxx11::string::compare((char *)local_88);
  if (iVar2 != 0) {
    __assert_fail("value == \"docorate!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/structural/decorator_test.cc"
                  ,10,"int main()");
  }
  (**pEVar3->_vptr_Element)(&local_68,pEVar3);
  std::__cxx11::string::operator=((string *)local_88,(string *)&local_68);
  paVar1 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  iVar2 = std::__cxx11::string::compare((char *)local_88);
  if (iVar2 == 0) {
    this = (AsteriskDecorator *)operator_new(0x10);
    (this->super_Decorator).element = pEVar3;
    (this->super_Decorator).super_Element._vptr_Element =
         (_func_int **)&PTR_print_abi_cxx11__00103d70;
    AsteriskDecorator::print_abi_cxx11_(&local_68,this);
    std::__cxx11::string::operator=((string *)local_88,(string *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    iVar2 = std::__cxx11::string::compare((char *)local_88);
    if (iVar2 == 0) {
      this_00 = (PlusDecorator *)operator_new(0x10);
      pEVar4 = (Element *)operator_new(0x10);
      pEVar4[1]._vptr_Element = (_func_int **)pEVar3;
      pEVar4->_vptr_Element = (_func_int **)&PTR_print_abi_cxx11__00103d70;
      (this_00->super_Decorator).element = pEVar4;
      (this_00->super_Decorator).super_Element._vptr_Element =
           (_func_int **)&PTR_print_abi_cxx11__00103da0;
      PlusDecorator::print_abi_cxx11_(&local_68,this_00);
      std::__cxx11::string::operator=((string *)local_88,(string *)&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      iVar2 = std::__cxx11::string::compare((char *)local_88);
      if (iVar2 == 0) {
        if (local_88[0] != local_78) {
          operator_delete(local_88[0],local_78[0] + 1);
        }
        return 0;
      }
      __assert_fail("value == \"+*docorate!*+\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/structural/decorator_test.cc"
                    ,0x16,"int main()");
    }
    __assert_fail("value == \"*docorate!*\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/structural/decorator_test.cc"
                  ,0x12,"int main()");
  }
  __assert_fail("value == \"docorate!\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/structural/decorator_test.cc"
                ,0xe,"int main()");
}

Assistant:

int main() {
  Title* title = new Title("docorate!");
  std::string value = title->print();
  assert(value == "docorate!");

  Decorator* decorator = new Decorator(title);
  value = decorator->print();
  assert(value == "docorate!");

  decorator = new AsteriskDecorator(title);
  value = decorator->print();
  assert(value == "*docorate!*");

  decorator = new PlusDecorator(new AsteriskDecorator(title));
  value = decorator->print();
  assert(value == "+*docorate!*+");
}